

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Electromagnetic_Emission_PDU.cpp
# Opt level: O1

void __thiscall
KDIS::PDU::Electromagnetic_Emission_PDU::Decode
          (Electromagnetic_Emission_PDU *this,KDataStream *stream,bool ignoreHeader)

{
  KUINT16 KVar1;
  KException *this_00;
  int iVar2;
  undefined7 in_register_00000011;
  byte bVar3;
  EmissionSystem local_78;
  
  KVar1 = KDataStream::GetBufferSize(stream);
  iVar2 = 0xc;
  if ((int)CONCAT71(in_register_00000011,ignoreHeader) == 0) {
    iVar2 = 0;
  }
  if (0x1b < iVar2 + (uint)KVar1) {
    Header7::Decode(&this->super_Header,stream,ignoreHeader);
    (*(this->m_EmittingEntityID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase[3]
    )(&this->m_EmittingEntityID,stream);
    (*(this->m_EventID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase[3])
              (&this->m_EventID,stream);
    KDataStream::Read(stream,&this->m_ui8StateUpdateIndicator);
    KDataStream::Read(stream,&this->m_ui8NumberOfEmissionSystems);
    KDataStream::Read<unsigned_short>(stream,&this->m_ui16Padding);
    if (this->m_ui8NumberOfEmissionSystems != '\0') {
      bVar3 = 0;
      do {
        DATA_TYPE::EmissionSystem::EmissionSystem(&local_78,stream);
        std::
        vector<KDIS::DATA_TYPE::EmissionSystem,_std::allocator<KDIS::DATA_TYPE::EmissionSystem>_>::
        emplace_back<KDIS::DATA_TYPE::EmissionSystem>(&this->m_vEmissionSystem,&local_78);
        DATA_TYPE::EmissionSystem::~EmissionSystem(&local_78);
        bVar3 = bVar3 + 1;
      } while (bVar3 < this->m_ui8NumberOfEmissionSystems);
    }
    return;
  }
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  local_78.super_DataTypeBase._vptr_DataTypeBase = (_func_int **)&local_78.m_EmitterSystemRecord;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"Decode","");
  KException::KException(this_00,(KString *)&local_78,2);
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

void Electromagnetic_Emission_PDU::Decode(KDataStream &stream, bool ignoreHeader /*= true*/ ) noexcept(false)
{
    if( ( stream.GetBufferSize() + ( ignoreHeader ? Header::HEADER6_PDU_SIZE : 0 ) ) < ELECTROMAGNETIC_EMISSION_PDU_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    Header::Decode( stream, ignoreHeader );

    stream >> KDIS_STREAM m_EmittingEntityID
           >> KDIS_STREAM m_EventID
           >> m_ui8StateUpdateIndicator
           >> m_ui8NumberOfEmissionSystems
           >> m_ui16Padding;

    for( KUINT8 i = 0; i < m_ui8NumberOfEmissionSystems; ++i )
    {
        m_vEmissionSystem.push_back( EmissionSystem( stream ) );
    }
}